

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeMovetoUnpacked
              (BtCursor *pCur,UnpackedRecord *pIdxKey,i64 intKey,int biasRight,int *pRes)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  KeyInfo *pKVar6;
  MemPage *pMVar7;
  long lVar8;
  int iVar9;
  byte *pbVar10;
  uchar *pBuf;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  u8 *puVar15;
  u32 amt;
  int unaff_R14D;
  char cVar16;
  bool bVar17;
  i64 nCellKey;
  int local_94;
  code *local_80;
  int local_6c;
  u64 local_38;
  
  if (pIdxKey == (UnpackedRecord *)0x0) {
    if ((pCur->eState == '\0') && ((pCur->curFlags & 2) != 0)) {
      lVar8 = (pCur->info).nKey;
      if (lVar8 == intKey) {
        *pRes = 0;
        return 0;
      }
      if (lVar8 < intKey) {
        if ((pCur->curFlags & 8) != 0) goto LAB_0014a6df;
        if (lVar8 + 1 == intKey) {
          *pRes = 0;
          iVar9 = sqlite3BtreeNext(pCur,0);
          if (iVar9 != 0x65) {
            if (iVar9 != 0) {
              return iVar9;
            }
            getCellInfo(pCur);
            if ((pCur->info).nKey == intKey) {
              return 0;
            }
          }
        }
      }
    }
    local_80 = (code *)0x0;
  }
  else {
    pKVar6 = pIdxKey->pKeyInfo;
    if (pKVar6->nAllField < 0xe) {
      uVar5 = pIdxKey->aMem->flags;
      bVar17 = *pKVar6->aSortOrder == '\0';
      pIdxKey->r1 = -bVar17 | 1;
      pIdxKey->r2 = -!bVar17 | 1;
      if ((uVar5 & 4) == 0) {
        if (((uVar5 & 0x19) == 0) && (pKVar6->aColl[0] == (CollSeq *)0x0)) {
          local_80 = vdbeRecordCompareString;
          goto LAB_0014a197;
        }
        bVar17 = true;
      }
      else {
        local_80 = vdbeRecordCompareInt;
LAB_0014a197:
        bVar17 = false;
      }
      if (bVar17) goto LAB_0014a1a2;
    }
    else {
LAB_0014a1a2:
      local_80 = sqlite3VdbeRecordCompare;
    }
    pIdxKey->errCode = '\0';
  }
  iVar9 = moveToRoot(pCur);
  if (iVar9 != 0x10) {
    if (iVar9 != 0) {
      return iVar9;
    }
    local_94 = 0;
    do {
      pMVar7 = pCur->pPage;
      iVar9 = pMVar7->nCell - 1;
      uVar13 = iVar9 >> (1U - (char)biasRight & 0x1f);
      pCur->ix = (u16)uVar13;
      if (local_80 == (code *)0x0) {
        uVar11 = 0;
        do {
          puVar15 = pMVar7->aDataOfst +
                    (CONCAT11(pMVar7->aCellIdx[(long)(int)uVar13 * 2],
                              pMVar7->aCellIdx[(long)(int)uVar13 * 2 + 1]) & pMVar7->maskPage);
          if (pMVar7->intKeyLeaf == '\0') {
LAB_0014a4c8:
            sqlite3GetVarint(puVar15,&local_38);
            if ((long)local_38 < intKey) {
              uVar11 = uVar13 + 1;
              if ((int)uVar13 < iVar9) {
LAB_0014a504:
                uVar13 = (int)(iVar9 + uVar11) >> 1;
                cVar16 = '\0';
              }
              else {
                unaff_R14D = -1;
LAB_0014a558:
                cVar16 = '\x04';
              }
            }
            else {
              if (intKey < (long)local_38) {
                iVar9 = uVar13 - 1;
                if ((int)uVar11 < (int)uVar13) goto LAB_0014a504;
                unaff_R14D = 1;
                goto LAB_0014a558;
              }
              pCur->ix = (u16)uVar13;
              if (pMVar7->leaf != '\0') {
                pCur->curFlags = pCur->curFlags | 2;
                (pCur->info).nKey = local_38;
                (pCur->info).nSize = 0;
                *pRes = 0;
                local_6c = 0;
                goto LAB_0014a54a;
              }
              cVar16 = '\b';
              uVar11 = uVar13;
            }
          }
          else {
            do {
              if (-1 < (char)*puVar15) {
                puVar15 = puVar15 + 1;
                goto LAB_0014a4c8;
              }
              puVar15 = puVar15 + 1;
            } while (puVar15 < pMVar7->aDataEnd);
            local_6c = 0xb;
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x10c20);
LAB_0014a54a:
            cVar16 = '\x01';
          }
        } while (cVar16 == '\0');
        if (cVar16 == '\x04') goto LAB_0014a589;
        if (cVar16 != '\b') goto LAB_0014a635;
LAB_0014a5b8:
        if ((int)uVar11 < (int)(uint)pMVar7->nCell) {
          lVar8 = (ulong)(CONCAT11(pMVar7->aCellIdx[(long)(int)uVar11 * 2],
                                   pMVar7->aCellIdx[(long)(int)uVar11 * 2 + 1]) & pMVar7->maskPage)
                  + 3;
        }
        else {
          lVar8 = (ulong)pMVar7->hdrOffset + 0xb;
        }
        pbVar10 = pMVar7->aData + lVar8;
        bVar1 = pbVar10[-3];
        bVar2 = pbVar10[-2];
        bVar3 = pbVar10[-1];
        bVar4 = *pbVar10;
        pCur->ix = (u16)uVar11;
        local_94 = moveToChild(pCur,(uint)bVar4 |
                                    (uint)bVar3 << 8 | (uint)bVar2 << 0x10 | (uint)bVar1 << 0x18);
        cVar16 = (local_94 != 0) * '\x02';
      }
      else {
        uVar11 = 0;
        do {
          puVar15 = pMVar7->aDataOfst;
          uVar12 = (ulong)(CONCAT11(pMVar7->aCellIdx[(long)(int)uVar13 * 2],
                                    pMVar7->aCellIdx[(long)(int)uVar13 * 2 + 1]) & pMVar7->maskPage)
          ;
          pbVar10 = puVar15 + uVar12 + 1;
          bVar1 = puVar15[uVar12];
          uVar14 = (uint)bVar1;
          if (pMVar7->max1bytePayload < bVar1) {
            if ((-1 < (char)*pbVar10) &&
               (uVar14 = (bVar1 & 0x7f) << 7 | (int)(char)*pbVar10, uVar14 <= pMVar7->maxLocal)) {
              pbVar10 = puVar15 + uVar12 + 2;
              goto LAB_0014a2ea;
            }
            (*pMVar7->xParseCell)(pMVar7,puVar15 + (uVar12 - pMVar7->childPtrSize),&pCur->info);
            uVar12 = (pCur->info).nKey;
            amt = (u32)uVar12;
            if (((int)amt < 2) ||
               (pCur->pBt->nPage < (uint)((uVar12 & 0xffffffff) / (ulong)pCur->pBt->usableSize))) {
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x10c6a);
              local_94 = 0xb;
LAB_0014a358:
              bVar17 = false;
              cVar16 = '\v';
            }
            else {
              pBuf = (uchar *)sqlite3Malloc((ulong)(amt + 0x12));
              if (pBuf == (uchar *)0x0) {
                local_94 = 7;
                goto LAB_0014a358;
              }
              pCur->ix = (u16)uVar13;
              local_94 = accessPayload(pCur,0,amt,pBuf,0);
              pCur->curFlags = pCur->curFlags & 0xfb;
              if (local_94 != 0) {
                sqlite3_free(pBuf);
                goto LAB_0014a358;
              }
              cVar16 = '\0';
              unaff_R14D = sqlite3VdbeRecordCompareWithSkip(amt,pBuf,pIdxKey,0);
              sqlite3_free(pBuf);
              bVar17 = true;
              local_94 = 0;
            }
            if (bVar17) goto LAB_0014a36b;
          }
          else {
LAB_0014a2ea:
            unaff_R14D = (*local_80)(uVar14,pbVar10,pIdxKey);
LAB_0014a36b:
            if (unaff_R14D < 0) {
              uVar11 = uVar13 + 1;
            }
            else {
              if (unaff_R14D == 0) {
                *pRes = 0;
                pCur->ix = (u16)uVar13;
                if (pIdxKey->errCode == '\0') {
                  unaff_R14D = 0;
                  cVar16 = '\v';
                  local_94 = 0;
                }
                else {
                  cVar16 = '\v';
                  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x10c89);
                  unaff_R14D = 0;
                  local_94 = 0xb;
                }
                goto LAB_0014a404;
              }
              iVar9 = uVar13 - 1;
            }
            cVar16 = '\t';
            if ((int)uVar11 <= iVar9) {
              uVar13 = iVar9 + uVar11 >> 1;
              cVar16 = '\0';
            }
          }
LAB_0014a404:
        } while (cVar16 == '\0');
        if (cVar16 == '\t') {
LAB_0014a589:
          if (pMVar7->leaf == '\0') goto LAB_0014a5b8;
          pCur->ix = (u16)uVar13;
          *pRes = unaff_R14D;
          local_94 = 0;
          cVar16 = '\v';
        }
      }
LAB_0014a635:
      if (cVar16 != '\0') {
        if ((cVar16 != '\v') && (cVar16 != '\x02')) {
          return local_6c;
        }
        (pCur->info).nSize = 0;
        return local_94;
      }
    } while( true );
  }
LAB_0014a6df:
  *pRes = -1;
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeMovetoUnpacked(
  BtCursor *pCur,          /* The cursor to be moved */
  UnpackedRecord *pIdxKey, /* Unpacked index key */
  i64 intKey,              /* The table key */
  int biasRight,           /* If true, bias the search to the high end */
  int *pRes                /* Write search results here */
){
  int rc;
  RecordCompare xRecordCompare;

  assert( cursorOwnsBtShared(pCur) );
  assert( sqlite3_mutex_held(pCur->pBtree->db->mutex) );
  assert( pRes );
  assert( (pIdxKey==0)==(pCur->pKeyInfo==0) );
  assert( pCur->eState!=CURSOR_VALID || (pIdxKey==0)==(pCur->curIntKey!=0) );

  /* If the cursor is already positioned at the point we are trying
  ** to move to, then just return without doing any work */
  if( pIdxKey==0
   && pCur->eState==CURSOR_VALID && (pCur->curFlags & BTCF_ValidNKey)!=0
  ){
    if( pCur->info.nKey==intKey ){
      *pRes = 0;
      return SQLITE_OK;
    }
    if( pCur->info.nKey<intKey ){
      if( (pCur->curFlags & BTCF_AtLast)!=0 ){
        *pRes = -1;
        return SQLITE_OK;
      }
      /* If the requested key is one more than the previous key, then
      ** try to get there using sqlite3BtreeNext() rather than a full
      ** binary search.  This is an optimization only.  The correct answer
      ** is still obtained without this case, only a little more slowely */
      if( pCur->info.nKey+1==intKey ){
        *pRes = 0;
        rc = sqlite3BtreeNext(pCur, 0);
        if( rc==SQLITE_OK ){
          getCellInfo(pCur);
          if( pCur->info.nKey==intKey ){
            return SQLITE_OK;
          }
        }else if( rc==SQLITE_DONE ){
          rc = SQLITE_OK;
        }else{
          return rc;
        }
      }
    }
  }

  if( pIdxKey ){
    xRecordCompare = sqlite3VdbeFindCompare(pIdxKey);
    pIdxKey->errCode = 0;
    assert( pIdxKey->default_rc==1 
         || pIdxKey->default_rc==0 
         || pIdxKey->default_rc==-1
    );
  }else{
    xRecordCompare = 0; /* All keys are integers */
  }

  rc = moveToRoot(pCur);
  if( rc ){
    if( rc==SQLITE_EMPTY ){
      assert( pCur->pgnoRoot==0 || pCur->pPage->nCell==0 );
      *pRes = -1;
      return SQLITE_OK;
    }
    return rc;
  }
  assert( pCur->pPage );
  assert( pCur->pPage->isInit );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->pPage->nCell > 0 );
  assert( pCur->iPage==0 || pCur->apPage[0]->intKey==pCur->curIntKey );
  assert( pCur->curIntKey || pIdxKey );
  for(;;){
    int lwr, upr, idx, c;
    Pgno chldPg;
    MemPage *pPage = pCur->pPage;
    u8 *pCell;                          /* Pointer to current cell in pPage */

    /* pPage->nCell must be greater than zero. If this is the root-page
    ** the cursor would have been INVALID above and this for(;;) loop
    ** not run. If this is not the root-page, then the moveToChild() routine
    ** would have already detected db corruption. Similarly, pPage must
    ** be the right kind (index or table) of b-tree page. Otherwise
    ** a moveToChild() or moveToRoot() call would have detected corruption.  */
    assert( pPage->nCell>0 );
    assert( pPage->intKey==(pIdxKey==0) );
    lwr = 0;
    upr = pPage->nCell-1;
    assert( biasRight==0 || biasRight==1 );
    idx = upr>>(1-biasRight); /* idx = biasRight ? upr : (lwr+upr)/2; */
    pCur->ix = (u16)idx;
    if( xRecordCompare==0 ){
      for(;;){
        i64 nCellKey;
        pCell = findCellPastPtr(pPage, idx);
        if( pPage->intKeyLeaf ){
          while( 0x80 <= *(pCell++) ){
            if( pCell>=pPage->aDataEnd ){
              return SQLITE_CORRUPT_PAGE(pPage);
            }
          }
        }
        getVarint(pCell, (u64*)&nCellKey);
        if( nCellKey<intKey ){
          lwr = idx+1;
          if( lwr>upr ){ c = -1; break; }
        }else if( nCellKey>intKey ){
          upr = idx-1;
          if( lwr>upr ){ c = +1; break; }
        }else{
          assert( nCellKey==intKey );
          pCur->ix = (u16)idx;
          if( !pPage->leaf ){
            lwr = idx;
            goto moveto_next_layer;
          }else{
            pCur->curFlags |= BTCF_ValidNKey;
            pCur->info.nKey = nCellKey;
            pCur->info.nSize = 0;
            *pRes = 0;
            return SQLITE_OK;
          }
        }
        assert( lwr+upr>=0 );
        idx = (lwr+upr)>>1;  /* idx = (lwr+upr)/2; */
      }
    }else{
      for(;;){
        int nCell;  /* Size of the pCell cell in bytes */
        pCell = findCellPastPtr(pPage, idx);

        /* The maximum supported page-size is 65536 bytes. This means that
        ** the maximum number of record bytes stored on an index B-Tree
        ** page is less than 16384 bytes and may be stored as a 2-byte
        ** varint. This information is used to attempt to avoid parsing 
        ** the entire cell by checking for the cases where the record is 
        ** stored entirely within the b-tree page by inspecting the first 
        ** 2 bytes of the cell.
        */
        nCell = pCell[0];
        if( nCell<=pPage->max1bytePayload ){
          /* This branch runs if the record-size field of the cell is a
          ** single byte varint and the record fits entirely on the main
          ** b-tree page.  */
          testcase( pCell+nCell+1==pPage->aDataEnd );
          c = xRecordCompare(nCell, (void*)&pCell[1], pIdxKey);
        }else if( !(pCell[1] & 0x80) 
          && (nCell = ((nCell&0x7f)<<7) + pCell[1])<=pPage->maxLocal
        ){
          /* The record-size field is a 2 byte varint and the record 
          ** fits entirely on the main b-tree page.  */
          testcase( pCell+nCell+2==pPage->aDataEnd );
          c = xRecordCompare(nCell, (void*)&pCell[2], pIdxKey);
        }else{
          /* The record flows over onto one or more overflow pages. In
          ** this case the whole cell needs to be parsed, a buffer allocated
          ** and accessPayload() used to retrieve the record into the
          ** buffer before VdbeRecordCompare() can be called. 
          **
          ** If the record is corrupt, the xRecordCompare routine may read
          ** up to two varints past the end of the buffer. An extra 18 
          ** bytes of padding is allocated at the end of the buffer in
          ** case this happens.  */
          void *pCellKey;
          u8 * const pCellBody = pCell - pPage->childPtrSize;
          pPage->xParseCell(pPage, pCellBody, &pCur->info);
          nCell = (int)pCur->info.nKey;
          testcase( nCell<0 );   /* True if key size is 2^32 or more */
          testcase( nCell==0 );  /* Invalid key size:  0x80 0x80 0x00 */
          testcase( nCell==1 );  /* Invalid key size:  0x80 0x80 0x01 */
          testcase( nCell==2 );  /* Minimum legal index key size */
          if( nCell<2 || nCell/pCur->pBt->usableSize>pCur->pBt->nPage ){
            rc = SQLITE_CORRUPT_PAGE(pPage);
            goto moveto_finish;
          }
          pCellKey = sqlite3Malloc( nCell+18 );
          if( pCellKey==0 ){
            rc = SQLITE_NOMEM_BKPT;
            goto moveto_finish;
          }
          pCur->ix = (u16)idx;
          rc = accessPayload(pCur, 0, nCell, (unsigned char*)pCellKey, 0);
          pCur->curFlags &= ~BTCF_ValidOvfl;
          if( rc ){
            sqlite3_free(pCellKey);
            goto moveto_finish;
          }
          c = sqlite3VdbeRecordCompare(nCell, pCellKey, pIdxKey);
          sqlite3_free(pCellKey);
        }
        assert( 
            (pIdxKey->errCode!=SQLITE_CORRUPT || c==0)
         && (pIdxKey->errCode!=SQLITE_NOMEM || pCur->pBtree->db->mallocFailed)
        );
        if( c<0 ){
          lwr = idx+1;
        }else if( c>0 ){
          upr = idx-1;
        }else{
          assert( c==0 );
          *pRes = 0;
          rc = SQLITE_OK;
          pCur->ix = (u16)idx;
          if( pIdxKey->errCode ) rc = SQLITE_CORRUPT_BKPT;
          goto moveto_finish;
        }
        if( lwr>upr ) break;
        assert( lwr+upr>=0 );
        idx = (lwr+upr)>>1;  /* idx = (lwr+upr)/2 */
      }
    }
    assert( lwr==upr+1 || (pPage->intKey && !pPage->leaf) );
    assert( pPage->isInit );
    if( pPage->leaf ){
      assert( pCur->ix<pCur->pPage->nCell );
      pCur->ix = (u16)idx;
      *pRes = c;
      rc = SQLITE_OK;
      goto moveto_finish;
    }
moveto_next_layer:
    if( lwr>=pPage->nCell ){
      chldPg = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    }else{
      chldPg = get4byte(findCell(pPage, lwr));
    }
    pCur->ix = (u16)lwr;
    rc = moveToChild(pCur, chldPg);
    if( rc ) break;
  }
moveto_finish:
  pCur->info.nSize = 0;
  assert( (pCur->curFlags & BTCF_ValidOvfl)==0 );
  return rc;
}